

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::MultiPartOutputFile::Data::headerNameUniquenessCheck
          (Data *this,vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *headers)

{
  _Rb_tree_header *p_Var1;
  pointer pHVar2;
  string *psVar3;
  iterator iVar4;
  ArgExc *this_00;
  ulong uVar5;
  long lVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  
  p_Var1 = &names._M_t._M_impl.super__Rb_tree_header;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar6 = 0;
  uVar5 = 0;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  while( true ) {
    pHVar2 = (headers->super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(headers->
                       super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pHVar2) / 0x38) <= uVar5) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&names._M_t);
      return;
    }
    psVar3 = Header::name_abi_cxx11_((Header *)((long)&(pHVar2->_map)._M_t._M_impl + lVar6));
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&names,psVar3);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var1) break;
    psVar3 = Header::name_abi_cxx11_
                       ((Header *)
                        ((long)&(((headers->
                                  super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl +
                        lVar6));
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&names,psVar3);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x38;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,"Each part should have a unique name.");
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
MultiPartOutputFile::Data::headerNameUniquenessCheck (const vector<Header> &headers)
{
    set<string> names;
    for (size_t i = 0; i < headers.size(); i++)
    {
        if (names.find(headers[i].name()) != names.end())
            throw IEX_NAMESPACE::ArgExc ("Each part should have a unique name.");
        names.insert(headers[i].name());
    }
}